

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase489::run(TestCase489 *this)

{
  Reader reader;
  Disposer *pDVar1;
  Server *pSVar2;
  long *plVar3;
  ClientHook *pCVar4;
  CapTableBuilder *pCVar5;
  undefined8 uVar6;
  Disposer *pDVar7;
  RequestHook *pRVar8;
  WirePointer *pWVar9;
  int iVar10;
  WirePointer *pWVar11;
  int iVar12;
  int iVar13;
  undefined8 *__n;
  void *__buf;
  void *__buf_00;
  int in_R8D;
  Own<capnp::ClientHook> OVar14;
  Reader RVar15;
  int callCount;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response1;
  Client client2;
  WaitScope waitScope;
  Response<capnproto_test::capnp::test::TestAllTypes> response2;
  Client client;
  RemotePromise<capnproto_test::capnp::test::TestAllTypes> promise2;
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> promise1;
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  request2;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request1;
  EventLoop loop;
  undefined1 local_25c [4];
  Own<capnp::Capability::Server> local_258;
  WirePointer *local_240;
  short local_234;
  int local_230;
  undefined8 *local_228;
  long *local_220;
  pointer_____offset_0x10___ *local_218;
  undefined8 *local_210;
  long *local_208;
  EventLoop *local_200;
  undefined4 local_1f8;
  Client local_1f0;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 *local_1c0;
  long *local_1b8;
  undefined1 local_1b0 [16];
  ClientHook *pCStack_1a0;
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  local_198;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_160;
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  local_128;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_f0;
  PointerReader local_b8;
  ArrayPtr<const_char> local_98;
  EventLoop local_88;
  Maybe<capnp::MessageSize> local_50;
  Maybe<capnp::MessageSize> local_38;
  
  kj::EventLoop::EventLoop(&local_88);
  local_1f8 = 0xffffffff;
  local_200 = &local_88;
  kj::EventLoop::enterScope(&local_88);
  local_25c = (undefined1  [4])0x0;
  local_258.ptr = (Server *)operator_new(0x20);
  (local_258.ptr)->thisHook = (ClientHook *)0x0;
  local_258.ptr[1]._vptr_Server = (_func_int **)0x63b558;
  (local_258.ptr)->_vptr_Server = (_func_int **)&PTR_dispatchCall_0062bf88;
  local_258.ptr[1].thisHook = (ClientHook *)local_25c;
  __n = &kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestExtendsDynamicImpl>::instance;
  local_258.disposer =
       (Disposer *)
       &kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestExtendsDynamicImpl>::instance;
  OVar14 = Capability::Client::makeLocalClient(&local_1f0,&local_258);
  pSVar2 = local_258.ptr;
  if (local_258.ptr != (Server *)0x0) {
    local_258.ptr = (Server *)0x0;
    (*(code *)((Arena *)(local_258.disposer)->_vptr_Disposer)->_vptr_Arena)
              (local_258.disposer,
               (_func_int *)((long)&pSVar2->_vptr_Server + (long)pSVar2->_vptr_Server[-2]),
               OVar14.ptr);
  }
  local_1e0 = 0x63b558;
  (*(local_1f0.hook.ptr)->_vptr_ClientHook[4])(&local_258);
  pCVar4 = local_1f0.hook.ptr;
  pSVar2 = local_258.ptr;
  pDVar1 = local_258.disposer;
  if (local_1f0.hook.ptr != (ClientHook *)0x0) {
    local_1f0.hook.ptr = (ClientHook *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_1f0.hook.disposer._4_4_,local_1f0.hook.disposer._0_4_)
    )((undefined8 *)CONCAT44(local_1f0.hook.disposer._4_4_,local_1f0.hook.disposer._0_4_),
      pCVar4->_vptr_ClientHook[-2] + (long)&pCVar4->_vptr_ClientHook);
  }
  (*pSVar2->_vptr_Server[4])(&local_210,pSVar2);
  local_218 = &Capability::Client::typeinfo;
  (**(code **)(*local_208 + 0x20))(&local_1f0);
  local_1b0._8_8_ = CONCAT44(local_1f0.hook.disposer._4_4_,local_1f0.hook.disposer._0_4_);
  pCStack_1a0 = local_1f0.hook.ptr;
  local_1b0._0_8_ = &capnproto_test::capnp::test::TestExtends::Client::typeinfo;
  local_38.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            (&local_f0,(Client *)local_1b0,&local_38);
  *(undefined4 *)local_f0.super_Builder._builder.data = 0x141;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send(&local_160,(int)&local_f0,__buf,(size_t)__n,in_R8D);
  local_50.ptr.isSet = false;
  capnproto_test::capnp::test::TestExtends::Client::graultRequest
            (&local_128,(Client *)local_1b0,&local_50);
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::send(&local_198,(int)&local_128,__buf_00,(size_t)__n,in_R8D);
  if ((local_25c != (undefined1  [4])0x0) && (kj::_::Debug::minSeverity < 3)) {
    local_1f0.hook.disposer._0_4_ = 0;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x1fb,ERROR,"\"failed: expected \" \"(0) == (callCount)\", 0, callCount",
               (char (*) [36])"failed: expected (0) == (callCount)",(int *)&local_1f0,
               (int *)local_25c);
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_> *)&local_1f0,
             &local_198);
  reader._reader.segment._4_4_ = local_1f0.hook.disposer._4_4_;
  reader._reader.segment._0_4_ = local_1f0.hook.disposer._0_4_;
  reader._reader.capTable = (CapTableReader *)local_1f0.hook.ptr;
  reader._reader.data = (void *)local_1e0;
  reader._reader.pointers = (WirePointer *)uStack_1d8;
  reader._reader.dataSize = (undefined4)local_1d0;
  reader._reader.pointerCount = local_1d0._4_2_;
  reader._reader._38_2_ = local_1d0._6_2_;
  reader._reader._40_8_ = uStack_1c8;
  checkTestMessage(reader);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             &local_258,&local_160);
  local_b8.capTable = (CapTableReader *)local_258.ptr;
  local_b8.pointer = local_240;
  local_b8.segment = (SegmentReader *)local_258.disposer;
  local_b8.nestingLimit = local_230;
  if (local_234 == 0) {
    local_b8.capTable = (CapTableReader *)(Server *)0x0;
    local_b8.pointer = (WirePointer *)0x0;
    local_b8.segment = (SegmentReader *)0x0;
    local_b8.nestingLimit = 0x7fffffff;
  }
  RVar15 = PointerReader::getBlob<capnp::Text>(&local_b8,(void *)0x0,0);
  pWVar11 = local_240;
  iVar12 = local_230;
  pWVar9 = local_b8.pointer;
  iVar10 = local_b8.nestingLimit;
  if (((RVar15.super_StringPtr.content.size_ != 4) ||
      (iVar13 = bcmp(RVar15.super_StringPtr.content.ptr,"bar",3), pWVar9 = local_b8.pointer,
      iVar10 = local_b8.nestingLimit, pWVar11 = local_240, iVar12 = local_230, iVar13 != 0)) &&
     (local_b8.nestingLimit = iVar12, local_b8.pointer = pWVar11, kj::_::Debug::minSeverity < 3)) {
    local_b8.capTable = (CapTableReader *)local_258.ptr;
    local_b8.segment = (SegmentReader *)local_258.disposer;
    if (local_234 == 0) {
      local_b8.nestingLimit = 0x7fffffff;
      local_b8.pointer = (WirePointer *)0x0;
      local_b8.capTable = (CapTableReader *)(Server *)0x0;
      local_b8.segment = (SegmentReader *)0x0;
    }
    local_98 = (ArrayPtr<const_char>)PointerReader::getBlob<capnp::Text>(&local_b8,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[47],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x203,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (response1.getX())\", \"bar\", response1.getX()"
               ,(char (*) [47])"failed: expected (\"bar\") == (response1.getX())",
               (char (*) [4])0x502717,(Reader *)&local_98);
    pWVar9 = local_b8.pointer;
    iVar10 = local_b8.nestingLimit;
  }
  local_b8.nestingLimit = iVar10;
  local_b8.pointer = pWVar9;
  if ((local_25c != (undefined1  [4])0x2) && (kj::_::Debug::minSeverity < 3)) {
    local_b8.segment = (SegmentReader *)CONCAT44(local_b8.segment._4_4_,2);
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x205,ERROR,"\"failed: expected \" \"(2) == (callCount)\", 2, callCount",
               (char (*) [36])"failed: expected (2) == (callCount)",(int *)&local_b8,
               (int *)local_25c);
  }
  plVar3 = local_220;
  if (local_220 != (long *)0x0) {
    local_220 = (long *)0x0;
    (**(code **)*local_228)(local_228,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  plVar3 = local_1b8;
  if (local_1b8 != (long *)0x0) {
    local_1b8 = (long *)0x0;
    (**(code **)*local_1c0)(local_1c0,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  pDVar7 = local_198.hook.disposer;
  uVar6 = local_198.super_Builder._builder._32_8_;
  if (local_198.super_Builder._builder._32_8_ != 0) {
    local_198.super_Builder._builder.dataSize = 0;
    local_198.super_Builder._builder.pointerCount = 0;
    local_198.super_Builder._builder._38_2_ = 0;
    local_198.hook.disposer = (Disposer *)0x0;
    (**(local_198.hook.ptr)->_vptr_RequestHook)(local_198.hook.ptr,uVar6,8,pDVar7,pDVar7,0);
  }
  pWVar9 = local_198.super_Builder._builder.pointers;
  if (local_198.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_198.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_198.super_Builder._builder.data)
              (local_198.super_Builder._builder.data,
               (long)&(pWVar9->offsetAndKind).value + *(long *)((long)*pWVar9 + -0x10));
  }
  pCVar5 = local_198.super_Builder._builder.capTable;
  if (local_198.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_198.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_198.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_198.super_Builder._builder.segment,
      (pCVar5->super_CapTableReader)._vptr_CapTableReader[-2] +
      (long)&(pCVar5->super_CapTableReader)._vptr_CapTableReader);
  }
  pRVar8 = local_128.hook.ptr;
  if (local_128.hook.ptr != (RequestHook *)0x0) {
    local_128.hook.ptr = (RequestHook *)0x0;
    (**(local_128.hook.disposer)->_vptr_Disposer)
              (local_128.hook.disposer,
               pRVar8->_vptr_RequestHook[-2] + (long)&pRVar8->_vptr_RequestHook);
  }
  pDVar7 = local_160.hook.disposer;
  uVar6 = local_160.super_Builder._builder._32_8_;
  if (local_160.super_Builder._builder._32_8_ != 0) {
    local_160.super_Builder._builder.dataSize = 0;
    local_160.super_Builder._builder.pointerCount = 0;
    local_160.super_Builder._builder._38_2_ = 0;
    local_160.hook.disposer = (Disposer *)0x0;
    (**(local_160.hook.ptr)->_vptr_RequestHook)(local_160.hook.ptr,uVar6,8,pDVar7,pDVar7,0);
  }
  pWVar9 = local_160.super_Builder._builder.pointers;
  if (local_160.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_160.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_160.super_Builder._builder.data)
              (local_160.super_Builder._builder.data,
               (long)&(pWVar9->offsetAndKind).value + *(long *)((long)*pWVar9 + -0x10));
  }
  pCVar5 = local_160.super_Builder._builder.capTable;
  if (local_160.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_160.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_160.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_160.super_Builder._builder.segment,
      (pCVar5->super_CapTableReader)._vptr_CapTableReader[-2] +
      (long)&(pCVar5->super_CapTableReader)._vptr_CapTableReader);
  }
  pRVar8 = local_f0.hook.ptr;
  if (local_f0.hook.ptr != (RequestHook *)0x0) {
    local_f0.hook.ptr = (RequestHook *)0x0;
    (**(local_f0.hook.disposer)->_vptr_Disposer)
              (local_f0.hook.disposer,
               pRVar8->_vptr_RequestHook[-2] + (long)&pRVar8->_vptr_RequestHook);
  }
  pCVar4 = pCStack_1a0;
  if (pCStack_1a0 != (ClientHook *)0x0) {
    pCStack_1a0 = (ClientHook *)0x0;
    (*(code *)**(undefined8 **)local_1b0._8_8_)
              (local_1b0._8_8_,pCVar4->_vptr_ClientHook[-2] + (long)&pCVar4->_vptr_ClientHook);
  }
  plVar3 = local_208;
  if (local_208 != (long *)0x0) {
    local_208 = (long *)0x0;
    (**(code **)*local_210)(local_210,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  (*(code *)((Arena *)pDVar1->_vptr_Disposer)->_vptr_Arena)
            (pDVar1,(_func_int *)((long)&pSVar2->_vptr_Server + (long)pSVar2->_vptr_Server[-2]));
  kj::EventLoop::leaveScope(local_200);
  kj::EventLoop::~EventLoop(&local_88);
  return;
}

Assistant:

TEST(Capability, DynamicServerInheritance) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  int callCount = 0;
  test::TestExtends::Client client1 =
      DynamicCapability::Client(kj::heap<TestExtendsDynamicImpl>(callCount))
          .castAs<test::TestExtends>();
  test::TestInterface::Client client2 = client1;
  auto client = client2.castAs<test::TestExtends>();

  auto request1 = client.fooRequest();
  request1.setI(321);
  auto promise1 = request1.send();

  auto request2 = client.graultRequest();
  auto promise2 = request2.send();

  EXPECT_EQ(0, callCount);

  auto response2 = promise2.wait(waitScope);

  checkTestMessage(response2);

  auto response1 = promise1.wait(waitScope);

  EXPECT_EQ("bar", response1.getX());

  EXPECT_EQ(2, callCount);
}